

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

uint32 __thiscall
LinearScan::GeneratorBailIn::GetOffsetFromInterpreterStackFrame
          (GeneratorBailIn *this,RegSlot regSlot)

{
  RegSlot RVar1;
  uint32 uVar2;
  
  RVar1 = JITTimeFunctionBody::GetLocalFrameDisplayReg(this->jitFnBody);
  uVar2 = 0x50;
  if (RVar1 != regSlot) {
    RVar1 = JITTimeFunctionBody::GetLocalClosureReg(this->jitFnBody);
    uVar2 = 0x58;
    if (RVar1 != regSlot) {
      RVar1 = JITTimeFunctionBody::GetParamClosureReg(this->jitFnBody);
      uVar2 = 0x60;
      if (RVar1 != regSlot) {
        uVar2 = regSlot * 8 + 0x160;
      }
    }
  }
  return uVar2;
}

Assistant:

uint32 LinearScan::GeneratorBailIn::GetOffsetFromInterpreterStackFrame(Js::RegSlot regSlot) const
{
    // Some objects aren't stored in the local space in interpreter frame, but instead
    // in their own fields. Use their offsets in such cases.
    if (regSlot == this->jitFnBody->GetLocalFrameDisplayReg())
    {
        return Js::InterpreterStackFrame::GetOffsetOfLocalFrameDisplay();
    }
    else if (regSlot == this->jitFnBody->GetLocalClosureReg())
    {
        return Js::InterpreterStackFrame::GetOffsetOfLocalClosure();
    }
    else if (regSlot == this->jitFnBody->GetParamClosureReg())
    {
        return Js::InterpreterStackFrame::GetOffsetOfParamClosure();
    }
    else
    {
        return regSlot * sizeof(Js::Var) + Js::InterpreterStackFrame::GetOffsetOfLocals();
    }
}